

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_java_struct_equality
          (t_java_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  e_req eVar2;
  pointer pptVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  t_type *ptVar7;
  logic_error *this_00;
  pointer pptVar8;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  bool bVar10;
  undefined1 auVar11 [12];
  string name;
  string this_present;
  string that_present;
  string unequal;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  t_generator::indent_abi_cxx11_(&name,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&name);
  poVar6 = std::operator<<(poVar6,"@Override");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&this_present,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&this_present);
  poVar6 = std::operator<<(poVar6,"public boolean equals(java.lang.Object that) {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&this_present);
  std::__cxx11::string::~string((string *)&name);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&name,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&name);
  poVar6 = std::operator<<(poVar6,"if (that instanceof ");
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var,iVar5));
  poVar6 = std::operator<<(poVar6,")");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&this_present,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&this_present);
  poVar6 = std::operator<<(poVar6,"  return this.equals((");
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_00,iVar5));
  poVar6 = std::operator<<(poVar6,")that);");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&that_present,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&that_present);
  poVar6 = std::operator<<(poVar6,"return false;");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&that_present);
  std::__cxx11::string::~string((string *)&this_present);
  std::__cxx11::string::~string((string *)&name);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&name,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&name);
  poVar6 = std::operator<<(poVar6,"public boolean equals(");
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_01,iVar5));
  poVar6 = std::operator<<(poVar6," that) {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&name);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&name,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&name);
  poVar6 = std::operator<<(poVar6,"if (that == null)");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&this_present,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&this_present);
  poVar6 = std::operator<<(poVar6,"  return false;");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&that_present,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&that_present);
  poVar6 = std::operator<<(poVar6,"if (this == that)");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&unequal,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&unequal);
  poVar6 = std::operator<<(poVar6,"  return true;");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&unequal);
  std::__cxx11::string::~string((string *)&that_present);
  std::__cxx11::string::~string((string *)&this_present);
  std::__cxx11::string::~string((string *)&name);
  for (pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar3 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_finish,
      std::operator<<(out,(string *)&::endl_abi_cxx11_), pptVar8 != pptVar3; pptVar8 = pptVar8 + 1)
  {
    ptVar7 = t_type::get_true_type((*pptVar8)->type_);
    eVar2 = (*pptVar8)->req_;
    bVar4 = type_can_be_null(this,ptVar7);
    std::__cxx11::string::string((string *)&name,(string *)&(*pptVar8)->name_);
    std::__cxx11::string::string((string *)&this_present,"true",(allocator *)&that_present);
    std::__cxx11::string::string((string *)&that_present,"true",(allocator *)&unequal);
    unequal._M_dataplus._M_p = (pointer)&unequal.field_2;
    unequal._M_string_length = 0;
    unequal.field_2._M_local_buf[0] = '\0';
    if (eVar2 == T_OPTIONAL || bVar4) {
      generate_isset_check_abi_cxx11_(&local_70,this,*pptVar8);
      std::operator+(&local_b0," && this.",&local_70);
      std::__cxx11::string::append((string *)&this_present);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      generate_isset_check_abi_cxx11_(&local_70,this,*pptVar8);
      std::operator+(&local_b0," && that.",&local_70);
      std::__cxx11::string::append((string *)&that_present);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
    }
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&local_b0);
    poVar6 = std::operator<<(poVar6,"boolean this_present_");
    poVar6 = std::operator<<(poVar6,(string *)&name);
    poVar6 = std::operator<<(poVar6," = ");
    poVar6 = std::operator<<(poVar6,(string *)&this_present);
    poVar6 = std::operator<<(poVar6,";");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_70);
    poVar6 = std::operator<<(poVar6,"boolean that_present_");
    poVar6 = std::operator<<(poVar6,(string *)&name);
    poVar6 = std::operator<<(poVar6," = ");
    poVar6 = std::operator<<(poVar6,(string *)&that_present);
    poVar6 = std::operator<<(poVar6,";");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_90);
    poVar6 = std::operator<<(poVar6,"if (");
    poVar6 = std::operator<<(poVar6,"this_present_");
    poVar6 = std::operator<<(poVar6,(string *)&name);
    poVar6 = std::operator<<(poVar6," || that_present_");
    poVar6 = std::operator<<(poVar6,(string *)&name);
    poVar6 = std::operator<<(poVar6,") {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&local_b0);
    poVar6 = std::operator<<(poVar6,"if (!(");
    poVar6 = std::operator<<(poVar6,"this_present_");
    poVar6 = std::operator<<(poVar6,(string *)&name);
    poVar6 = std::operator<<(poVar6," && that_present_");
    poVar6 = std::operator<<(poVar6,(string *)&name);
    poVar6 = std::operator<<(poVar6,"))");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_70);
    poVar6 = std::operator<<(poVar6,"  return false;");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[7])(ptVar7);
    if ((char)iVar5 == '\0') {
      if (bVar4) {
        std::operator+(&local_50,"!this.",&name);
        std::operator+(&local_90,&local_50,".equals(that.");
        std::operator+(&local_70,&local_90,&name);
        std::operator+(&local_b0,&local_70,")");
        goto LAB_0020457f;
      }
      std::operator+(&local_90,"this.",&name);
      std::operator+(&local_70,&local_90," != that.");
      std::operator+(&local_b0,&local_70,&name);
      std::__cxx11::string::operator=((string *)&unequal,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      this_01 = &local_90;
    }
    else {
      std::operator+(&local_50,"!this.",&name);
      std::operator+(&local_90,&local_50,".equals(that.");
      std::operator+(&local_70,&local_90,&name);
      std::operator+(&local_b0,&local_70,")");
LAB_0020457f:
      std::__cxx11::string::operator=((string *)&unequal,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      this_01 = &local_50;
    }
    std::__cxx11::string::~string((string *)this_01);
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&local_b0);
    poVar6 = std::operator<<(poVar6,"if (");
    poVar6 = std::operator<<(poVar6,(string *)&unequal);
    poVar6 = std::operator<<(poVar6,")");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_70);
    poVar6 = std::operator<<(poVar6,"  return false;");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    std::__cxx11::string::~string((string *)&unequal);
    std::__cxx11::string::~string((string *)&that_present);
    std::__cxx11::string::~string((string *)&this_present);
    std::__cxx11::string::~string((string *)&name);
  }
  poVar6 = t_generator::indent((t_generator *)this,out);
  poVar6 = std::operator<<(poVar6,"return true;");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&name,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&name);
  poVar6 = std::operator<<(poVar6,"@Override");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&this_present,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&this_present);
  poVar6 = std::operator<<(poVar6,"public int hashCode() {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&this_present);
  std::__cxx11::string::~string((string *)&name);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar6 = t_generator::indent((t_generator *)this,out);
  poVar6 = std::operator<<(poVar6,"int hashCode = 1;");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    pptVar3 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    if (pptVar8 == pptVar3) {
      poVar6 = t_generator::indent((t_generator *)this,out);
      poVar6 = std::operator<<(poVar6,"return hashCode;");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar6 = t_generator::indent((t_generator *)this,out);
      poVar6 = std::operator<<(poVar6,"}");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      return;
    }
    ptVar7 = t_type::get_true_type((*pptVar8)->type_);
    bVar10 = (*pptVar8)->req_ == T_OPTIONAL;
    bVar4 = type_can_be_null(this,ptVar7);
    std::__cxx11::string::string((string *)&name,(string *)&(*pptVar8)->name_);
    if (bVar4 || bVar10) {
      poVar6 = t_generator::indent((t_generator *)this,out);
      poVar6 = std::operator<<(poVar6,"hashCode = hashCode * ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1fff);
      poVar6 = std::operator<<(poVar6," + ((");
      generate_isset_check_abi_cxx11_(&this_present,this,*pptVar8);
      poVar6 = std::operator<<(poVar6,(string *)&this_present);
      poVar6 = std::operator<<(poVar6,") ? ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1ffff);
      poVar6 = std::operator<<(poVar6," : ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x7ffff);
      poVar6 = std::operator<<(poVar6,");");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&this_present);
      poVar6 = t_generator::indent((t_generator *)this,out);
      generate_isset_check_abi_cxx11_(&unequal,this,*pptVar8);
      std::operator+(&that_present,"if (",&unequal);
      std::operator+(&this_present,&that_present,")");
      poVar6 = std::operator<<(poVar6,(string *)&this_present);
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&this_present);
      std::__cxx11::string::~string((string *)&that_present);
      std::__cxx11::string::~string((string *)&unequal);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
    }
    iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[10])(ptVar7);
    if ((char)iVar5 == '\0') {
      iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[5])(ptVar7);
      if ((char)iVar5 == '\0') {
switchD_00204a57_caseD_1:
        poVar6 = t_generator::indent((t_generator *)this,out);
        poVar6 = std::operator<<(poVar6,"hashCode = hashCode * ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1fff);
        poVar6 = std::operator<<(poVar6," + ");
        poVar6 = std::operator<<(poVar6,(string *)&name);
        pcVar9 = ".hashCode();";
        goto LAB_00204bfd;
      }
      switch(*(undefined4 *)&ptVar7[1].super_t_doc._vptr_t_doc) {
      case 0:
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"compiler error: a struct field cannot be void");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      case 1:
        goto switchD_00204a57_caseD_1;
      case 2:
        poVar6 = t_generator::indent((t_generator *)this,out);
        poVar6 = std::operator<<(poVar6,"hashCode = hashCode * ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1fff);
        poVar6 = std::operator<<(poVar6," + ((");
        poVar6 = std::operator<<(poVar6,(string *)&name);
        poVar6 = std::operator<<(poVar6,") ? ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1ffff);
        poVar6 = std::operator<<(poVar6," : ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x7ffff);
        goto LAB_00204bf6;
      case 3:
        poVar6 = t_generator::indent((t_generator *)this,out);
        poVar6 = std::operator<<(poVar6,"hashCode = hashCode * ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1fff);
        pcVar9 = " + (int) (";
        break;
      case 4:
      case 5:
        poVar6 = t_generator::indent((t_generator *)this,out);
        poVar6 = std::operator<<(poVar6,"hashCode = hashCode * ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1fff);
        poVar6 = std::operator<<(poVar6," + ");
        poVar6 = std::operator<<(poVar6,(string *)&name);
        pcVar9 = ";";
        goto LAB_00204bfd;
      case 6:
      case 7:
        poVar6 = t_generator::indent((t_generator *)this,out);
        poVar6 = std::operator<<(poVar6,"hashCode = hashCode * ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1fff);
        pcVar9 = " + org.apache.thrift.TBaseHelper.hashCode(";
        break;
      default:
        auVar11 = __cxa_allocate_exception(0x10);
        t_base_type::t_base_name_abi_cxx11_
                  (&that_present,(t_base_type *)(ulong)*(uint *)&ptVar7[1].super_t_doc._vptr_t_doc,
                   auVar11._8_4_);
        std::operator+(&this_present,
                       "compiler error: the following base type has no hashcode generator: ",
                       &that_present);
        std::logic_error::logic_error(auVar11._0_8_,(string *)&this_present);
        __cxa_throw(auVar11._0_8_,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      poVar6 = std::operator<<(poVar6,pcVar9);
      poVar6 = std::operator<<(poVar6,(string *)&name);
LAB_00204bf6:
      pcVar9 = ");";
    }
    else {
      poVar6 = t_generator::indent((t_generator *)this,out);
      poVar6 = std::operator<<(poVar6,"hashCode = hashCode * ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1fff);
      poVar6 = std::operator<<(poVar6," + ");
      poVar6 = std::operator<<(poVar6,(string *)&name);
      pcVar9 = ".getValue();";
    }
LAB_00204bfd:
    poVar6 = std::operator<<(poVar6,pcVar9);
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    if (bVar4 || bVar10) {
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
    }
    std::__cxx11::string::~string((string *)&name);
    pptVar8 = pptVar8 + 1;
  } while( true );
}

Assistant:

void t_java_generator::generate_java_struct_equality(ostream& out, t_struct* tstruct) {
  out << indent() << "@Override" << endl << indent() << "public boolean equals(java.lang.Object that) {"
      << endl;
  indent_up();
  out << indent() << "if (that instanceof " << tstruct->get_name() << ")" << endl << indent()
      << "  return this.equals((" << tstruct->get_name() << ")that);" << endl << indent()
      << "return false;" << endl;
  scope_down(out);
  out << endl;

  out << indent() << "public boolean equals(" << tstruct->get_name() << " that) {" << endl;
  indent_up();
  out << indent() << "if (that == null)" << endl << indent() << "  return false;" << endl
      << indent() << "if (this == that)" << endl << indent() << "  return true;"  << endl;

  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    out << endl;

    t_type* t = get_true_type((*m_iter)->get_type());
    // Most existing Thrift code does not use isset or optional/required,
    // so we treat "default" fields as required.
    bool is_optional = (*m_iter)->get_req() == t_field::T_OPTIONAL;
    bool can_be_null = type_can_be_null(t);
    string name = (*m_iter)->get_name();

    string this_present = "true";
    string that_present = "true";
    string unequal;

    if (is_optional || can_be_null) {
      this_present += " && this." + generate_isset_check(*m_iter);
      that_present += " && that." + generate_isset_check(*m_iter);
    }

    out << indent() << "boolean this_present_" << name << " = " << this_present << ";" << endl
        << indent() << "boolean that_present_" << name << " = " << that_present << ";" << endl
        << indent() << "if ("
        << "this_present_" << name << " || that_present_" << name << ") {" << endl;
    indent_up();
    out << indent() << "if (!("
        << "this_present_" << name << " && that_present_" << name << "))" << endl << indent()
        << "  return false;" << endl;

    if (t->is_binary()) {
      unequal = "!this." + name + ".equals(that." + name + ")";
    } else if (can_be_null) {
      unequal = "!this." + name + ".equals(that." + name + ")";
    } else {
      unequal = "this." + name + " != that." + name;
    }

    out << indent() << "if (" << unequal << ")" << endl << indent() << "  return false;" << endl;

    scope_down(out);
  }
  out << endl;
  indent(out) << "return true;" << endl;
  scope_down(out);
  out << endl;

  const int MUL = 8191; // HashCode multiplier
  const int B_YES = 131071;
  const int B_NO = 524287;
  out << indent() << "@Override" << endl << indent() << "public int hashCode() {" << endl;
  indent_up();
  indent(out) << "int hashCode = 1;" << endl;

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    out << endl;

    t_type* t = get_true_type((*m_iter)->get_type());
    bool is_optional = (*m_iter)->get_req() == t_field::T_OPTIONAL;
    bool can_be_null = type_can_be_null(t);
    string name = (*m_iter)->get_name();

    if (is_optional || can_be_null) {
      indent(out) << "hashCode = hashCode * " << MUL << " + ((" << generate_isset_check(*m_iter)
                  << ") ? " << B_YES << " : " << B_NO << ");" << endl;
    }

    if (is_optional || can_be_null) {
      indent(out) << "if (" + generate_isset_check(*m_iter) + ")" << endl;
      indent_up();
    }

    if (t->is_enum()) {
      indent(out) << "hashCode = hashCode * " << MUL << " + " << name << ".getValue();" << endl;
    } else if (t->is_base_type()) {
      switch(((t_base_type*)t)->get_base()) {
      case t_base_type::TYPE_STRING:
        indent(out) << "hashCode = hashCode * " << MUL << " + " << name << ".hashCode();" << endl;
        break;
      case t_base_type::TYPE_BOOL:
        indent(out) << "hashCode = hashCode * " << MUL << " + ((" << name << ") ? "
                    << B_YES << " : " << B_NO << ");" << endl;
        break;
      case t_base_type::TYPE_I8:
        indent(out) << "hashCode = hashCode * " << MUL << " + (int) (" << name << ");" << endl;
        break;
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
        indent(out) << "hashCode = hashCode * " << MUL << " + " << name << ";" << endl;
        break;
      case t_base_type::TYPE_I64:
      case t_base_type::TYPE_DOUBLE:
        indent(out) << "hashCode = hashCode * " << MUL << " + org.apache.thrift.TBaseHelper.hashCode(" << name << ");" << endl;
        break;
      case t_base_type::TYPE_VOID:
        throw std::logic_error("compiler error: a struct field cannot be void");
      default:
        throw std::logic_error("compiler error: the following base type has no hashcode generator: " +
               t_base_type::t_base_name(((t_base_type*)t)->get_base()));
      }
    } else {
      indent(out) << "hashCode = hashCode * " << MUL << " + " << name << ".hashCode();" << endl;
    }

    if (is_optional || can_be_null) {
      indent_down();
    }
  }

  out << endl;
  indent(out) << "return hashCode;" << endl;
  indent_down();
  indent(out) << "}" << endl << endl;
}